

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O1

UVec3 __thiscall vkt::image::getLayerSize(image *this,ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  UVec3 UVar4;
  
  UVar4.m_data[2] = (uint)imageSize;
  uVar1 = 1;
  if (imageType < IMAGE_TYPE_LAST) {
    if ((0x6cU >> (imageType & 0x1f) & 1) != 0) {
      uVar2 = imageSize->m_data[0];
      uVar3 = imageSize->m_data[1];
      goto LAB_00757cb9;
    }
    if ((0x83U >> (imageType & 0x1f) & 1) == 0) {
      uVar2 = imageSize->m_data[0];
      uVar3 = imageSize->m_data[1];
      uVar1 = imageSize->m_data[2];
      goto LAB_00757cb9;
    }
    uVar2 = imageSize->m_data[0];
  }
  else {
    uVar2 = 1;
  }
  uVar3 = 1;
LAB_00757cb9:
  *(uint *)this = uVar2;
  *(uint *)(this + 4) = uVar3;
  *(uint *)(this + 8) = uVar1;
  UVar4.m_data._0_8_ = this;
  return (UVec3)UVar4.m_data;
}

Assistant:

tcu::UVec3 getLayerSize (const ImageType imageType, const tcu::UVec3& imageSize)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_1D_ARRAY:
		case IMAGE_TYPE_BUFFER:
			return tcu::UVec3(imageSize.x(), 1u, 1u);

		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 1u);

		case IMAGE_TYPE_3D:
			return tcu::UVec3(imageSize.x(), imageSize.y(), imageSize.z());

		default:
			DE_FATAL("Unknown image type");
			return tcu::UVec3(1u, 1u, 1u);
	}
}